

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O1

llb_build_key_t * llb_build_key_make_custom_task_with_data(char *name,llb_data_t data)

{
  CAPIBuildKey *this;
  size_t sVar1;
  StringRef name_00;
  BuildKey local_50;
  StringRef local_30;
  
  this = (CAPIBuildKey *)operator_new(0x38);
  if (name == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(name);
  }
  name_00.Length = sVar1;
  name_00.Data = name;
  local_30.Data = (char *)data.data;
  local_30.Length = data.length;
  llbuild::buildsystem::BuildKey::BuildKey<llvm::StringRef>(&local_50,'X',name_00,&local_30);
  anon_unknown.dwarf_2c083d::CAPIBuildKey::CAPIBuildKey(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.key.key._M_dataplus._M_p != &local_50.key.key.field_2) {
    operator_delete(local_50.key.key._M_dataplus._M_p,
                    local_50.key.key.field_2._M_allocated_capacity + 1);
  }
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_custom_task_with_data(const char *name, llb_data_t data) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeCustomTask(StringRef(name), StringRef((const char *)data.data, data.length)));
}